

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void Am_Visible_Animator_Interrupt_proc(Am_Object *interp,Am_Value *new_target)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value *value2;
  Am_Object *this;
  Am_Object sub_animator;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value old_target;
  
  pAVar2 = Am_Object::Get(interp,0xf9,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(interp,0x182,0);
    Am_Value::Am_Value(&old_target,pAVar2);
    bVar1 = Am_Value::operator==(&old_target,new_target);
    if (bVar1) {
      Am_Object::Am_Object(&local_40,interp);
      Am_Abort_Animator(&local_40);
      this = &local_40;
    }
    else {
      pAVar2 = Am_Object::Get(interp,0x108,0);
      Am_Object::Am_Object(&sub_animator,pAVar2);
      Am_Object::Am_Object(&local_48,&sub_animator);
      Am_Abort_Animator(&local_48);
      Am_Object::~Am_Object(&local_48);
      Am_Object::Am_Object(&local_50,&sub_animator);
      pAVar2 = Am_Object::Get(&sub_animator,0x169,0);
      bVar1 = Am_Value::operator_cast_to_bool(new_target);
      value2 = Am_Object::Get(interp,0x10a - bVar1,0);
      Am_Start_Animator(&local_50,pAVar2,value2);
      Am_Object::~Am_Object(&local_50);
      Am_Object::Set(interp,0x181,&old_target,0);
      Am_Object::Set(interp,0x182,new_target,0);
      Am_Object::Set(interp,0x169,true,0);
      Am_Object::Am_Object(&local_58,interp);
      Am_Set_Animated_Slots(&local_58);
      Am_Object::~Am_Object(&local_58);
      this = &sub_animator;
    }
    Am_Object::~Am_Object(this);
    Am_Value::~Am_Value(&old_target);
  }
  else {
    pAVar2 = Am_Object::Get(&Am_Animator,0xf5,0);
    Am_Anim_Update_Method::Am_Anim_Update_Method((Am_Anim_Update_Method *)&old_target,pAVar2);
    Am_Object::Am_Object(&local_38,interp);
    (*old_target.value.proc_value)(&local_38,new_target);
    Am_Object::~Am_Object(&local_38);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Anim_Update_Method, void, Am_Visible_Animator_Interrupt,
                 (Am_Object interp, const Am_Value &new_target))
{
  Am_INTER_TRACE_PRINT(interp, "Visible Interrupt of " << interp);

  if ((bool)interp.Get(Am_INTERRUPTIBLE)) {
    Am_Value old_target = interp.Get(Am_VALUE_2);

    if (old_target == new_target) {
      // interrupted animation to target with another set to the same target;
      // just abort
      Am_Abort_Animator(interp);
    } else {
      // need to reverse course and head back in the other direction,
      // but without sudden jumps in sub-animator
      Am_INTER_TRACE_PRINT(
          interp, "Visible Interrupt changing direction, now animating to "
                      << new_target);

      // abort sub animator first (which leaves it at current position)
      Am_Object sub_animator = interp.Get(Am_SUB_ANIMATOR);
      Am_Abort_Animator(sub_animator);

      // sub-animator should start from its current position (Am_VALUE)
      // and head for either visible or invisible location,
      // depending on new_target
      Am_Start_Animator(sub_animator, sub_animator.Get(Am_VALUE),
                        interp.Get((bool)new_target ? Am_VISIBLE_LOCATION
                                                    : Am_INVISIBLE_LOCATION));

      interp.Set(Am_VALUE_1, old_target);
      interp.Set(Am_VALUE_2, new_target);
      interp.Set(Am_VALUE, true); //make visible throughout animation

      Am_Set_Animated_Slots(interp);
    }
  } else {
    // not interruptible -- pass back to prototype's method

    Am_Anim_Update_Method(Am_Animator.Get(Am_INTERRUPT_METHOD))
        .Call(interp, new_target);
  }
}